

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patchtexture.cpp
# Opt level: O2

void __thiscall FPatchTexture::~FPatchTexture(FPatchTexture *this)

{
  (this->super_FTexture)._vptr_FTexture = (_func_int **)&PTR__FPatchTexture_007043d8;
  Unload(this);
  if (this->Spans != (Span **)0x0) {
    FTexture::FreeSpans(&this->super_FTexture,this->Spans);
    this->Spans = (Span **)0x0;
  }
  FTexture::~FTexture(&this->super_FTexture);
  return;
}

Assistant:

FPatchTexture::~FPatchTexture ()
{
	Unload ();
	if (Spans != NULL)
	{
		FreeSpans (Spans);
		Spans = NULL;
	}
}